

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

ssize_t iso9660_write_data(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  mode_t mVar2;
  ssize_t r;
  iso9660_conflict *iso9660;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if (*(long *)((long)pvVar1 + 0x10) == 0) {
    a_local = (archive_write *)0x0;
  }
  else {
    mVar2 = archive_entry_filetype(*(archive_entry **)(*(long *)((long)pvVar1 + 0x10) + 0x20));
    if (mVar2 == 0x8000) {
      iso9660 = (iso9660_conflict *)s;
      if (*(ulong *)((long)pvVar1 + 0x38) < s) {
        iso9660 = *(iso9660_conflict **)((long)pvVar1 + 0x38);
      }
      if (iso9660 == (iso9660_conflict *)0x0) {
        a_local = (archive_write *)0x0;
      }
      else {
        a_local = (archive_write *)write_iso9660_data(a,buff,(size_t)iso9660);
        if (0 < (long)a_local) {
          *(long *)((long)pvVar1 + 0x38) = *(long *)((long)pvVar1 + 0x38) - (long)a_local;
        }
      }
    }
    else {
      a_local = (archive_write *)0x0;
    }
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
iso9660_write_data(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	ssize_t r;

	if (iso9660->cur_file == NULL)
		return (0);
	if (archive_entry_filetype(iso9660->cur_file->entry) != AE_IFREG)
		return (0);
	if (s > iso9660->bytes_remaining)
		s = (size_t)iso9660->bytes_remaining;
	if (s == 0)
		return (0);

	r = write_iso9660_data(a, buff, s);
	if (r > 0)
		iso9660->bytes_remaining -= r;
	return (r);
}